

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall wallet::CWallet::GetNewChangeDestination(CWallet *this,OutputType type)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *op_dest;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  ReserveDestination reservedest;
  undefined4 in_stack_ffffffffffffff28;
  OutputType in_stack_ffffffffffffff2c;
  CWallet *this_00;
  undefined1 in_stack_ffffffffffffff4b;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  CWallet *this_01;
  undefined1 in_stack_ffffffffffffff87;
  ReserveDestination *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_01,in_RSI,
             (char *)CONCAT44(in_EDX,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff4c,(bool)in_stack_ffffffffffffff4b);
  ReserveDestination::ReserveDestination
            ((ReserveDestination *)this_00,in_RDI,in_stack_ffffffffffffff2c);
  ReserveDestination::GetReservedDestination
            (in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  bVar2 = util::Result::operator_cast_to_bool
                    ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                      *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar2) {
    ReserveDestination::KeepDestination((ReserveDestination *)this_00);
  }
  ReserveDestination::~ReserveDestination
            ((ReserveDestination *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> CWallet::GetNewChangeDestination(const OutputType type)
{
    LOCK(cs_wallet);

    ReserveDestination reservedest(this, type);
    auto op_dest = reservedest.GetReservedDestination(true);
    if (op_dest) reservedest.KeepDestination();

    return op_dest;
}